

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5SegIterNextPage(Fts5Index *p,Fts5SegIter *pIter)

{
  uchar *p_00;
  int iVar1;
  Fts5Data *pFVar2;
  undefined8 *in_RSI;
  Fts5StructureSegment *pSeg;
  Fts5Data *pLeaf;
  i64 in_stack_ffffffffffffffd8;
  Fts5Index *p_01;
  
  p_01 = (Fts5Index *)*in_RSI;
  fts5DataRelease((Fts5Data *)0x271878);
  *(int *)((long)in_RSI + 0xc) = *(int *)((long)in_RSI + 0xc) + 1;
  if (in_RSI[3] == 0) {
    if (*(int *)&p_01->zDataTbl < *(int *)((long)in_RSI + 0xc)) {
      in_RSI[2] = 0;
    }
    else {
      pFVar2 = fts5LeafRead(p_01,in_stack_ffffffffffffffd8);
      in_RSI[2] = pFVar2;
    }
  }
  else {
    in_RSI[2] = in_RSI[3];
    in_RSI[3] = 0;
  }
  p_00 = (uchar *)in_RSI[2];
  if (p_00 != (uchar *)0x0) {
    *(undefined4 *)(in_RSI + 8) = *(undefined4 *)(p_00 + 0xc);
    if (*(int *)(p_00 + 0xc) < *(int *)(p_00 + 8)) {
      iVar1 = sqlite3Fts5GetVarint32(p_00,(u32 *)p_01);
      *(int *)(in_RSI + 8) = iVar1 + *(int *)(in_RSI + 8);
    }
    else {
      *(int *)((long)in_RSI + 0x44) = *(int *)(p_00 + 8) + 1;
    }
  }
  return;
}

Assistant:

static void fts5SegIterNextPage(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5SegIter *pIter              /* Iterator to advance to next page */
){
  Fts5Data *pLeaf;
  Fts5StructureSegment *pSeg = pIter->pSeg;
  fts5DataRelease(pIter->pLeaf);
  pIter->iLeafPgno++;
  if( pIter->pNextLeaf ){
    pIter->pLeaf = pIter->pNextLeaf;
    pIter->pNextLeaf = 0;
  }else if( pIter->iLeafPgno<=pSeg->pgnoLast ){
    pIter->pLeaf = fts5LeafRead(p,
        FTS5_SEGMENT_ROWID(pSeg->iSegid, pIter->iLeafPgno)
    );
  }else{
    pIter->pLeaf = 0;
  }
  pLeaf = pIter->pLeaf;

  if( pLeaf ){
    pIter->iPgidxOff = pLeaf->szLeaf;
    if( fts5LeafIsTermless(pLeaf) ){
      pIter->iEndofDoclist = pLeaf->nn+1;
    }else{
      pIter->iPgidxOff += fts5GetVarint32(&pLeaf->p[pIter->iPgidxOff],
          pIter->iEndofDoclist
      );
    }
  }
}